

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O3

void append_states(void)

{
  int iVar1;
  Yshort *pYVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  
  iVar3 = nshifts;
  pYVar2 = shift_symbol;
  lVar4 = (long)nshifts;
  if (1 < lVar4) {
    lVar5 = 1;
    iVar6 = 2;
    do {
      iVar1 = pYVar2[lVar5];
      iVar7 = iVar6;
      do {
        uVar8 = iVar7 - 1;
        if (pYVar2[(ulong)uVar8 - 1] <= iVar1) goto LAB_0010db78;
        pYVar2[uVar8] = pYVar2[(ulong)uVar8 - 1];
        iVar7 = iVar7 + -1;
      } while (1 < iVar7);
      uVar8 = 0;
LAB_0010db78:
      pYVar2[(int)uVar8] = iVar1;
      lVar5 = lVar5 + 1;
      iVar6 = iVar6 + 1;
    } while (lVar5 != lVar4);
  }
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      iVar3 = get_state(shift_symbol[lVar4]);
      shiftset[lVar4] = iVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 < nshifts);
  }
  return;
}

Assistant:

void append_states()
{
    register int i;
    register int j;
    register int symbol;

#ifdef	TRACE
    fprintf(stderr, "Entering append_states()\n");
#endif
    for (i = 1; i < nshifts; i++)
    {
	symbol = shift_symbol[i];
	j = i;
	while (j > 0 && shift_symbol[j - 1] > symbol)
	{
	    shift_symbol[j] = shift_symbol[j - 1];
	    j--;
	}
	shift_symbol[j] = symbol;
    }

    for (i = 0; i < nshifts; i++)
    {
	symbol = shift_symbol[i];
	shiftset[i] = get_state(symbol);
    }
}